

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

p_ply ply_open(char *name,p_ply_error_cb error_cb,long idata,void *pdata)

{
  int iVar1;
  p_ply __ptr;
  size_t sVar2;
  void *in_RCX;
  long in_RDX;
  p_ply_error_cb in_RSI;
  char *in_RDI;
  p_ply ply;
  gzFile gzfp;
  FILE *fp;
  gzFile local_38;
  FILE *local_30;
  p_ply_error_cb local_18;
  
  local_30 = (FILE *)0x0;
  local_38 = (gzFile)0x0;
  __ptr = ply_alloc();
  local_18 = in_RSI;
  if (in_RSI == (p_ply_error_cb)0x0) {
    local_18 = ply_error_cb;
  }
  if (__ptr == (p_ply)0x0) {
    (*local_18)((p_ply)0x0,"Out of memory");
    return (p_ply)0x0;
  }
  __ptr->idata = in_RDX;
  __ptr->pdata = in_RCX;
  __ptr->io_mode = PLY_READ;
  __ptr->error_cb = local_18;
  iVar1 = ply_type_check();
  if (iVar1 == 0) {
    (*local_18)(__ptr,"Incompatible type system");
    free(__ptr);
    return (p_ply)0x0;
  }
  sVar2 = strlen(in_RDI);
  if ((3 < sVar2) && (sVar2 = strlen(in_RDI), in_RDI[sVar2 - 3] == '.')) {
    sVar2 = strlen(in_RDI);
    iVar1 = tolower((int)in_RDI[sVar2 - 2]);
    if (iVar1 == 0x67) {
      sVar2 = strlen(in_RDI);
      iVar1 = tolower((int)in_RDI[sVar2 - 1]);
      if (iVar1 == 0x7a) {
        local_38 = (gzFile)gzopen(in_RDI,"rb");
        if (local_38 == (gzFile)0x0) {
          (*local_18)(__ptr,"Unable to open file");
          free(__ptr);
          return (p_ply)0x0;
        }
        goto LAB_0068678b;
      }
    }
  }
  local_30 = fopen(in_RDI,"rb");
  if (local_30 == (FILE *)0x0) {
    (*local_18)(__ptr,"Unable to open file");
    free(__ptr);
    return (p_ply)0x0;
  }
LAB_0068678b:
  __ptr->fp = (FILE *)local_30;
  __ptr->gzfp = local_38;
  return __ptr;
}

Assistant:

p_ply ply_open(const char *name, p_ply_error_cb error_cb, long idata,
               void *pdata) {
    FILE *fp = NULL;
    gzFile gzfp = NULL;
    p_ply ply = ply_alloc();
    if (error_cb == NULL) error_cb = ply_error_cb;
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_READ;
    ply->error_cb = error_cb;
    if (!ply_type_check()) {
        error_cb(ply, "Incompatible type system");
        free(ply);
        return NULL;
    }
    assert(name);
    // Is it gzipped?
    if (strlen(name) > 3 &&
        name[strlen(name)-3] == '.' &&
        std::tolower(name[strlen(name)-2]) == 'g' &&
        std::tolower(name[strlen(name)-1]) == 'z') {
         gzfp = gzopen(name, "rb");
         if (!gzfp) {
            error_cb(ply, "Unable to open file");
            free(ply);
            return NULL;
        }
    }
    else {
        fp = fopen(name, "rb");
        if (!fp) {
            error_cb(ply, "Unable to open file");
            free(ply);
            return NULL;
        }
    }
    ply->fp = fp;
    ply->gzfp = gzfp;
    return ply;
}